

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int in_EDX;
  FuncState *in_RSI;
  long *in_RDI;
  
  if (*(int *)&in_RSI->f == 0xd) {
    *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) =
         *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) & 0xff803fff |
         (in_EDX + 1U & 0x1ff) << 0xe;
  }
  else if (*(int *)&in_RSI->f == 0xe) {
    *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) =
         *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) & 0x7fffff |
         (in_EDX + 1) * 0x800000;
    *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) =
         *(uint *)(*(long *)(*in_RDI + 0x18) + (long)*(int *)&in_RSI->h * 4) & 0xffffc03f |
         (*(uint *)((long)in_RDI + 0x3c) & 0xff) << 6;
    luaK_reserveregs(in_RSI,in_EDX);
  }
  return;
}

Assistant:

static void luaK_setreturns(FuncState*fs,expdesc*e,int nresults){
if(e->k==VCALL){
SETARG_C(getcode(fs,e),nresults+1);
}
else if(e->k==VVARARG){
SETARG_B(getcode(fs,e),nresults+1);
SETARG_A(getcode(fs,e),fs->freereg);
luaK_reserveregs(fs,1);
}
}